

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_ObjMarkTfo_rec(Acb_Ntk_t *p,int iObj,int nTfoLevMax,int nFanMax,Vec_Int_t *vMarked)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  
  if ((-1 < iObj) && (iObj < (p->vObjTrav).nSize)) {
    piVar2 = (p->vObjTrav).pArray;
    iVar4 = p->nObjTravs;
    iVar1 = piVar2[(uint)iObj];
    piVar2[(uint)iObj] = iVar4;
    if (iVar1 != iVar4) {
      Vec_IntPush(vMarked,iObj);
      if (iObj == 0) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x113,"int Acb_ObjLevelD(Acb_Ntk_t *, int)");
      }
      if ((p->vLevelD).nSize <= iObj) goto LAB_003a0cb7;
      if ((p->vLevelD).pArray[(uint)iObj] <= nTfoLevMax) {
        iVar4 = (p->vFanouts).nSize;
        if (iObj < iVar4) {
          if (nFanMax < (p->vFanouts).pArray[(uint)iObj].nSize) {
            return;
          }
          lVar5 = 0;
          do {
            pVVar3 = (p->vFanouts).pArray;
            if (pVVar3[(uint)iObj].nSize <= lVar5) {
              return;
            }
            iVar1 = pVVar3[(uint)iObj].pArray[lVar5];
            if ((long)iVar1 < 1) {
              __assert_fail("i>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                            ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
            }
            if ((p->vObjType).nSize <= iVar1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            if ((p->vObjType).pArray[iVar1] != '\0') {
              Acb_ObjMarkTfo_rec(p,iVar1,nTfoLevMax,nFanMax,vMarked);
              iVar4 = (p->vFanouts).nSize;
            }
            lVar5 = lVar5 + 1;
          } while (iObj < iVar4);
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
    }
    return;
  }
LAB_003a0cb7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_ObjMarkTfo_rec( Acb_Ntk_t * p, int iObj, int nTfoLevMax, int nFanMax, Vec_Int_t * vMarked )
{
    int iFanout, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    Vec_IntPush( vMarked, iObj );
    if ( Acb_ObjLevelD(p, iObj) > nTfoLevMax || Acb_ObjFanoutNum(p, iObj) > nFanMax )
        return;
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        Acb_ObjMarkTfo_rec( p, iFanout, nTfoLevMax, nFanMax, vMarked );
}